

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O3

size_t __thiscall
MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::
insert(DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_> *this,
      vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
      *siblings)

{
  size_t sVar1;
  unit_t *puVar2;
  int *piVar3;
  long lVar4;
  bool bVar5;
  ulong uVar6;
  size_t sVar7;
  pointer pnVar8;
  long lVar9;
  ulong uVar10;
  pointer pnVar11;
  pointer pnVar12;
  ulong uVar13;
  size_t sVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  double dVar21;
  vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
  new_siblings;
  long local_50;
  vector<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
  local_48;
  
  if (this->error_ < 0) {
LAB_001627bf:
    sVar14 = 0;
  }
  else {
    uVar10 = (ulong)((siblings->
                     super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                     )._M_impl.super__Vector_impl_data._M_start)->code + 1;
    if (uVar10 <= this->next_check_pos_) {
      uVar10 = this->next_check_pos_;
    }
    if (this->alloc_size_ <= uVar10 - 1) {
      resize(this,uVar10);
    }
    local_50 = 0;
    bVar5 = false;
    uVar10 = uVar10 - 1;
    while( true ) {
      do {
        while( true ) {
          uVar13 = uVar10;
          uVar10 = uVar13 + 1;
          if (this->alloc_size_ <= uVar10) {
            resize(this,uVar13 + 2);
          }
          if (this->array_[uVar13 + 1].check == 0) break;
          local_50 = local_50 + 1;
        }
        if (!bVar5) {
          this->next_check_pos_ = uVar10;
        }
        sVar14 = uVar10 - ((siblings->
                           super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                           )._M_impl.super__Vector_impl_data._M_start)->code;
        uVar6 = this->alloc_size_;
        if (uVar6 <= (siblings->
                     super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].code + sVar14) {
          auVar16._8_4_ = (int)(uVar6 >> 0x20);
          auVar16._0_8_ = uVar6;
          auVar16._12_4_ = 0x45300000;
          sVar7 = this->key_size_;
          auVar17._8_4_ = (int)(sVar7 >> 0x20);
          auVar17._0_8_ = sVar7;
          auVar17._12_4_ = 0x45300000;
          sVar1 = this->progress_;
          auVar18._8_4_ = (int)(sVar1 >> 0x20);
          auVar18._0_8_ = sVar1;
          auVar18._12_4_ = 0x45300000;
          dVar21 = ((auVar17._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar7) - 4503599627370496.0)) /
                   ((auVar18._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)sVar1) - 4503599627370496.0));
          dVar15 = 1.05;
          if (1.05 <= dVar21) {
            dVar15 = dVar21;
          }
          dVar15 = dVar15 * ((auVar16._8_8_ - 1.9342813113834067e+25) +
                            ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
          uVar6 = (ulong)dVar15;
          resize(this,(long)(dVar15 - 9.223372036854776e+18) & (long)uVar6 >> 0x3f | uVar6);
        }
        bVar5 = true;
      } while (this->used_[sVar14] != '\0');
      pnVar8 = (siblings->
               super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
               )._M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(siblings->
                    super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar8 >> 5;
      if (uVar6 < 2) break;
      lVar9 = uVar6 - 1;
      while (pnVar8 = pnVar8 + 1, this->array_[sVar14 + pnVar8->code].check == 0) {
        lVar9 = lVar9 + -1;
        if (lVar9 == 0) goto LAB_0016261b;
      }
    }
LAB_0016261b:
    auVar19._8_4_ = (int)((ulong)local_50 >> 0x20);
    auVar19._0_8_ = local_50;
    auVar19._12_4_ = 0x45300000;
    lVar9 = (uVar13 - this->next_check_pos_) + 2;
    auVar20._8_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar20._0_8_ = lVar9;
    auVar20._12_4_ = 0x45300000;
    if (0.95 <= ((auVar19._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)local_50) - 4503599627370496.0)) /
                ((auVar20._8_8_ - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)lVar9) - 4503599627370496.0))) {
      this->next_check_pos_ = uVar10;
    }
    this->used_[sVar14] = '\x01';
    pnVar8 = (siblings->
             super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar10 = (pnVar8[-1].code + 1) + sVar14;
    if (uVar10 < this->size_) {
      uVar10 = this->size_;
    }
    pnVar11 = (siblings->
              super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
              )._M_impl.super__Vector_impl_data._M_start;
    this->size_ = uVar10;
    if ((long)pnVar8 - (long)pnVar11 != 0) {
      lVar9 = (long)pnVar8 - (long)pnVar11 >> 5;
      puVar2 = this->array_;
      lVar9 = lVar9 + (ulong)(lVar9 == 0);
      pnVar12 = pnVar11;
      do {
        puVar2[sVar14 + pnVar12->code].check = (uint)sVar14;
        pnVar12 = pnVar12 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
      if (pnVar8 != pnVar11) {
        lVar9 = 0;
        uVar10 = 0;
        do {
          local_48.
          super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.
          super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.
          super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          sVar7 = fetch(this,(node_t *)((long)&pnVar11->code + lVar9),&local_48);
          if (sVar7 == 0) {
            piVar3 = this->value_;
            pnVar8 = (siblings->
                     super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            lVar4 = *(long *)((long)&pnVar8->left + lVar9);
            if (piVar3 == (int *)0x0) {
              this->array_[sVar14 + *(uint *)((long)&pnVar8->code + lVar9)].base = ~(uint)lVar4;
            }
            else {
              this->array_[sVar14 + *(uint *)((long)&pnVar8->code + lVar9)].base = ~piVar3[lVar4];
              if (piVar3[lVar4] < 0) {
                this->error_ = -2;
                if (local_48.
                    super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                    ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_48.
                                  super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
                }
                goto LAB_001627bf;
              }
            }
            sVar7 = this->progress_ + 1;
            this->progress_ = sVar7;
            if (this->progress_func_ != (_func_int_size_t_size_t *)0x0) {
              (*this->progress_func_)(sVar7,this->key_size_);
            }
          }
          else {
            sVar7 = insert(this,&local_48);
            this->array_
            [sVar14 + *(uint *)((long)&((siblings->
                                        super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                                        )._M_impl.super__Vector_impl_data._M_start)->code + lVar9)].
            base = (int)sVar7;
          }
          if (local_48.
              super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.
                            super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                            ._M_impl.super__Vector_impl_data._M_start);
          }
          uVar10 = uVar10 + 1;
          pnVar11 = (siblings->
                    super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                    )._M_impl.super__Vector_impl_data._M_start;
          lVar9 = lVar9 + 0x20;
        } while (uVar10 < (ulong)((long)(siblings->
                                        super__Vector_base<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t,_std::allocator<MeCab::Darts::DoubleArrayImpl<char,_unsigned_char,_int,_unsigned_int,_MeCab::Darts::Length<char>_>::node_t>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pnVar11
                                 >> 5));
      }
    }
  }
  return sVar14;
}

Assistant:

size_t insert(const std::vector <node_t> &siblings) {
    if (error_ < 0) return 0;

    size_t begin = 0;
    size_t pos   = _max((size_t)siblings[0].code + 1, next_check_pos_) - 1;
    size_t nonzero_num = 0;
    int    first = 0;

    if (alloc_size_ <= pos) resize(pos + 1);

    while (true) {
   next:
      ++pos;

      if (alloc_size_ <= pos) resize(pos + 1);

      if (array_[pos].check) {
        ++nonzero_num;
        continue;
      } else if (!first) {
        next_check_pos_ = pos;
        first = 1;
      }

      begin = pos - siblings[0].code;
      if (alloc_size_ <= (begin + siblings[siblings.size()-1].code))
        resize(static_cast<size_t>(alloc_size_ *
                                   _max(1.05, 1.0 * key_size_ / progress_)));

      if (used_[begin]) continue;

      for (size_t i = 1; i < siblings.size(); ++i)
        if (array_[begin + siblings[i].code].check != 0) goto next;

      break;
    }

    // -- Simple heuristics --
    // if the percentage of non-empty contents in check between the index
    // 'next_check_pos' and 'check' is greater than some constant
    // value(e.g. 0.9),
    // new 'next_check_pos' index is written by 'check'.
    if (1.0 * nonzero_num/(pos - next_check_pos_ + 1) >= 0.95)
      next_check_pos_ = pos;

    used_[begin] = 1;
    size_ = _max(size_,
                 begin +
                 static_cast<size_t>(siblings[siblings.size() - 1].code + 1));

    for (size_t i = 0; i < siblings.size(); ++i)
      array_[begin + siblings[i].code].check = begin;

    for (size_t i = 0; i < siblings.size(); ++i) {
      std::vector <node_t> new_siblings;

      if (!fetch(siblings[i], new_siblings)) {
        array_[begin + siblings[i].code].base =
            value_ ?
            static_cast<array_type_>(-value_[siblings[i].left]-1) :
            static_cast<array_type_>(-siblings[i].left-1);

        if (value_ && (array_type_)(-value_[siblings[i].left]-1) >= 0) {
          error_ = -2;
          return 0;
        }

        ++progress_;
        if (progress_func_)(*progress_func_)(progress_, key_size_);

      } else {
        size_t h = insert(new_siblings);
        array_[begin + siblings[i].code].base = h;
      }
    }

    return begin;
  }